

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh_modifiers.cpp
# Opt level: O0

bool __thiscall ON_Thickening::operator==(ON_Thickening *this,ON_Thickening *t)

{
  bool bVar1;
  bool bVar2;
  double dVar3;
  double dVar4;
  ON_Thickening *t_local;
  ON_Thickening *this_local;
  
  bVar1 = On(this);
  bVar2 = On(t);
  if (bVar1 == bVar2) {
    dVar3 = Distance(this);
    dVar4 = Distance(t);
    if ((dVar3 != dVar4) || (NAN(dVar3) || NAN(dVar4))) {
      this_local._7_1_ = false;
    }
    else {
      bVar1 = Solid(this);
      bVar2 = Solid(t);
      if (bVar1 == bVar2) {
        bVar1 = OffsetOnly(this);
        bVar2 = OffsetOnly(t);
        if (bVar1 == bVar2) {
          bVar1 = BothSides(this);
          bVar2 = BothSides(t);
          if (bVar1 == bVar2) {
            this_local._7_1_ = true;
          }
          else {
            this_local._7_1_ = false;
          }
        }
        else {
          this_local._7_1_ = false;
        }
      }
      else {
        this_local._7_1_ = false;
      }
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool ON_Thickening::operator == (const ON_Thickening& t) const
{
  if (On()         != t.On())         return false;
  if (Distance()   != t.Distance())   return false;
  if (Solid()      != t.Solid())      return false;
  if (OffsetOnly() != t.OffsetOnly()) return false;
  if (BothSides()  != t.BothSides())  return false;

  return true;
}